

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.h
# Opt level: O2

void __thiscall
slang::ast::RangeSelectExpression::visitExprs<slang::ast::LocalVarCheckVisitor&>
          (RangeSelectExpression *this,LocalVarCheckVisitor *visitor)

{
  Expression::visit<slang::ast::LocalVarCheckVisitor&>(this->value_,visitor);
  Expression::visit<slang::ast::LocalVarCheckVisitor&>(this->left_,visitor);
  Expression::visit<slang::ast::LocalVarCheckVisitor&>(this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        value().visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }